

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O0

Vec_Wec_t *
Acec_FindXorLeaves(Gia_Man_t *p,Vec_Int_t *vXors,Vec_Int_t *vAdds,Vec_Int_t *vXorRoots,
                  Vec_Int_t *vRanks,Vec_Wec_t **pvAddBoxes)

{
  int iVar1;
  int Level;
  int iVar2;
  int iVar3;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  Vec_Wec_t *p_03;
  int Fanin;
  int Rank;
  int Xor;
  int k;
  int i;
  Vec_Wec_t *vAddBoxes;
  Vec_Wec_t *vXorLeaves;
  Vec_Int_t *vMapMajs;
  Vec_Bit_t *vMapXors;
  Vec_Wec_t **pvAddBoxes_local;
  Vec_Int_t *vRanks_local;
  Vec_Int_t *vXorRoots_local;
  Vec_Int_t *vAdds_local;
  Vec_Int_t *vXors_local;
  Gia_Man_t *p_local;
  
  p_00 = Acec_MapXorOuts2(p,vXors,vRanks);
  p_01 = Acec_MapMajOuts2(p,vAdds,vRanks);
  iVar1 = Vec_IntSize(vXorRoots);
  p_02 = Vec_WecStart(iVar1);
  iVar1 = Vec_IntSize(vXorRoots);
  p_03 = Vec_WecStart(iVar1);
  Xor = 0;
  do {
    iVar1 = Vec_IntSize(vXors);
    if (iVar1 <= Xor << 2) {
      Vec_BitFree(p_00);
      Vec_IntFree(p_01);
      if (pvAddBoxes != (Vec_Wec_t **)0x0) {
        *pvAddBoxes = p_03;
      }
      return p_02;
    }
    iVar1 = Vec_IntEntry(vXors,Xor << 2);
    Level = Vec_IntEntry(vRanks,iVar1);
    if (Level != -1) {
      for (Rank = 1; Rank < 4; Rank = Rank + 1) {
        iVar2 = Vec_IntEntry(vXors,Xor * 4 + Rank);
        if (iVar2 != 0) {
          iVar3 = Vec_BitEntry(p_00,iVar2);
          if (iVar3 == 0) {
            iVar3 = Vec_IntEntry(p_01,iVar2);
            if (iVar3 == -1) {
              Vec_WecPush(p_02,Level,iVar2);
            }
            else {
              iVar3 = Vec_IntEntry(vRanks,iVar1);
              if (0 < iVar3) {
                iVar2 = Vec_IntEntry(p_01,iVar2);
                Vec_WecPush(p_03,Level + -1,iVar2);
              }
            }
          }
          else {
            iVar2 = Vec_IntEntry(vRanks,iVar2);
            if (Level != iVar2) {
              __assert_fail("Rank == Vec_IntEntry(vRanks, Fanin)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecXor.c"
                            ,0xf8,
                            "Vec_Wec_t *Acec_FindXorLeaves(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t **)"
                           );
            }
          }
        }
      }
    }
    Xor = Xor + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Acec_FindXorLeaves( Gia_Man_t * p, Vec_Int_t * vXors, Vec_Int_t * vAdds, Vec_Int_t * vXorRoots, Vec_Int_t * vRanks, Vec_Wec_t ** pvAddBoxes )
{
    Vec_Bit_t * vMapXors = Acec_MapXorOuts2( p, vXors, vRanks );
    Vec_Int_t * vMapMajs = Acec_MapMajOuts2( p, vAdds, vRanks );
    Vec_Wec_t * vXorLeaves = Vec_WecStart( Vec_IntSize(vXorRoots) );
    Vec_Wec_t * vAddBoxes  = Vec_WecStart( Vec_IntSize(vXorRoots) );
    int i, k;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        int Xor = Vec_IntEntry(vXors, 4*i);
        int Rank = Vec_IntEntry(vRanks, Xor);
        if ( Rank == -1 )
            continue;
        for ( k = 1; k < 4; k++ )
        {
            int Fanin = Vec_IntEntry(vXors, 4*i+k);
            //int RankFanin = Vec_IntEntry(vRanks, Fanin);
            if ( Fanin == 0 )
                continue;
            if ( Vec_BitEntry(vMapXors, Fanin) )
            {
                assert( Rank == Vec_IntEntry(vRanks, Fanin) );
                continue;
            }
//            if ( Vec_BitEntry(vMapXors, Fanin) && Rank == RankFanin )
//                continue;
            if ( Vec_IntEntry(vMapMajs, Fanin) == -1 ) // no adder driving this input
                Vec_WecPush( vXorLeaves, Rank, Fanin );
            else if ( Vec_IntEntry(vRanks, Xor) > 0 ) // save adder box
                Vec_WecPush( vAddBoxes, Rank-1, Vec_IntEntry(vMapMajs, Fanin) );
        }
    }
    Vec_BitFree( vMapXors );
    Vec_IntFree( vMapMajs );
    if ( pvAddBoxes )
        *pvAddBoxes = vAddBoxes;
    return vXorLeaves;
}